

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageUtil.cpp
# Opt level: O2

void __thiscall
deqp::egl::Image::NativeSurface<eglu::NativePixmap>::NativeSurface
          (NativeSurface<eglu::NativePixmap> *this,
          MovePtr<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_> *surface,
          MovePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_> *native)

{
  UniqueSurface *pUVar1;
  NativePixmap *pNVar2;
  UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_> local_20;
  
  pUVar1 = (surface->super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>
           ).m_data.ptr;
  (surface->super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>).m_data.
  ptr = (UniqueSurface *)0x0;
  (this->super_ManagedSurface)._vptr_ManagedSurface = (_func_int **)&PTR__ManagedSurface_01e09028;
  local_20.m_data.ptr = (UniqueSurface *)0x0;
  (this->super_ManagedSurface).m_surface.
  super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.m_data.ptr =
       pUVar1;
  de::details::UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>::
  ~UniqueBase(&local_20);
  (this->super_ManagedSurface)._vptr_ManagedSurface = (_func_int **)&PTR__NativeSurface_01e09090;
  pNVar2 = (native->super_UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>).
           m_data.ptr;
  (native->super_UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>).m_data.ptr
       = (NativePixmap *)0x0;
  (this->m_native).super_UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>.
  m_data.ptr = pNVar2;
  return;
}

Assistant:

explicit		NativeSurface	(MovePtr<UniqueSurface>	surface,
									 MovePtr<T>				native)
						: ManagedSurface	(surface)
						, m_native			(native) {}